

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry
          (RTPUDPv4Transmitter *this,uint32_t ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  size_t *psVar2;
  uint16_t uVar3;
  RTPMemoryManager *pRVar4;
  HashElement *pHVar5;
  _List_node_base *p_Var6;
  PortInfo *pPVar7;
  HashElement *pHVar8;
  _List_node_base *p_Var9;
  _Self __tmp;
  int iVar10;
  uint uVar11;
  bool bVar12;
  
  uVar11 = ip % 0x207d;
  pHVar8 = (this->acceptignoreinfo).table[uVar11];
  (this->acceptignoreinfo).curhashelem = pHVar8;
  bVar12 = false;
  do {
    if (pHVar8 == (HashElement *)0x0) break;
    if (pHVar8->key == ip) {
      bVar12 = true;
    }
    else {
      pHVar8 = pHVar8->hashnext;
      (this->acceptignoreinfo).curhashelem = pHVar8;
    }
  } while (!bVar12);
  pHVar8 = (this->acceptignoreinfo).curhashelem;
  if (pHVar8 != (HashElement *)0x0) {
    pPVar7 = pHVar8->element;
    if (port == 0) {
      pPVar7->all = true;
      std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar7->portlist);
      return 0;
    }
    if (pPVar7->all != false) {
      return 0;
    }
    p_Var9 = (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    bVar12 = p_Var9 == (_List_node_base *)&pPVar7->portlist;
    if (bVar12) {
LAB_00122187:
      p_Var9 = (_List_node_base *)operator_new(0x18);
      *(uint16_t *)&p_Var9[1]._M_next = port;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar2 = &(pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
    }
    else {
      uVar3 = *(uint16_t *)&p_Var9[1]._M_next;
      while (uVar3 != port) {
        p_Var9 = p_Var9->_M_next;
        bVar12 = p_Var9 == (_List_node_base *)&pPVar7->portlist;
        if (bVar12) goto LAB_00122187;
        uVar3 = *(uint16_t *)&p_Var9[1]._M_next;
      }
    }
    if (bVar12) {
      return 0;
    }
    return 0;
  }
  pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    pPVar7 = (PortInfo *)operator_new(0x20);
  }
  else {
    pPVar7 = (PortInfo *)(**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x20,0xc);
  }
  plVar1 = &pPVar7->portlist;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  _M_node._M_size = 0;
  pPVar7->all = false;
  if (port == 0) {
    pPVar7->all = true;
  }
  else {
    p_Var9 = (_List_node_base *)operator_new(0x18);
    *(uint16_t *)&p_Var9[1]._M_next = port;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    psVar2 = &(pPVar7->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
  }
  pHVar8 = (this->acceptignoreinfo).table[uVar11];
  if (pHVar8 != (HashElement *)0x0) {
    bVar12 = false;
    do {
      if (pHVar8->key == ip) {
        bVar12 = true;
      }
      else {
        pHVar8 = pHVar8->hashnext;
      }
    } while ((!bVar12) && (pHVar8 != (HashElement *)0x0));
    if (bVar12) {
      iVar10 = -9;
      bVar12 = true;
      goto LAB_00122229;
    }
  }
  pRVar4 = (this->acceptignoreinfo).super_RTPMemoryObject.mgr;
  if (pRVar4 == (RTPMemoryManager *)0x0) {
    pHVar8 = (HashElement *)operator_new(0x30);
  }
  else {
    pHVar8 = (HashElement *)
             (**(code **)(*(long *)pRVar4 + 0x10))(pRVar4,0x30,(this->acceptignoreinfo).memorytype);
  }
  pHVar8->key = ip;
  pHVar8->element = pPVar7;
  pHVar8->hashprev = (HashElement *)0x0;
  pHVar8->hashnext = (HashElement *)0x0;
  pHVar8->listprev = (HashElement *)0x0;
  pHVar8->listnext = (HashElement *)0x0;
  pHVar8->hashindex = uVar11;
  pHVar5 = (this->acceptignoreinfo).table[uVar11];
  (this->acceptignoreinfo).table[uVar11] = pHVar8;
  pHVar8->hashnext = pHVar5;
  if (pHVar5 != (HashElement *)0x0) {
    pHVar5->hashprev = pHVar8;
  }
  if ((this->acceptignoreinfo).firsthashelem == (HashElement *)0x0) {
    (this->acceptignoreinfo).firsthashelem = pHVar8;
  }
  else {
    pHVar5 = (this->acceptignoreinfo).lasthashelem;
    pHVar5->listnext = pHVar8;
    pHVar8->listprev = pHVar5;
  }
  (this->acceptignoreinfo).lasthashelem = pHVar8;
  bVar12 = false;
  iVar10 = 0;
LAB_00122229:
  if (bVar12) {
    pRVar4 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
    p_Var9 = (plVar1->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    if (pRVar4 == (RTPMemoryManager *)0x0) {
      while (p_Var9 != (_List_node_base *)plVar1) {
        p_Var6 = p_Var9->_M_next;
        operator_delete(p_Var9,0x18);
        p_Var9 = p_Var6;
      }
      operator_delete(pPVar7,0x20);
    }
    else {
      while (p_Var9 != (_List_node_base *)plVar1) {
        p_Var6 = p_Var9->_M_next;
        operator_delete(p_Var9,0x18);
        p_Var9 = p_Var6;
      }
      (**(code **)(*(long *)pRVar4 + 0x18))(pRVar4,pPVar7);
    }
    if (bVar12) {
      return iVar10;
    }
  }
  return 0;
}

Assistant:

int RTPUDPv4Transmitter::ProcessAddAcceptIgnoreEntry(uint32_t ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (acceptignoreinfo.HasCurrentElement()) // An entry for this IP address already exists
	{
		PortInfo *portinf = acceptignoreinfo.GetCurrentElement();
		
		if (port == 0) // select all ports
		{
			portinf->all = true;
			portinf->portlist.clear();
		}
		else if (!portinf->all)
		{
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = portinf->portlist.begin();
			end = portinf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list
					return 0;
			}
			portinf->portlist.push_front(port);
		}
	}
	else // got to create an entry for this IP address
	{
		PortInfo *portinf;
		int status;
		
		portinf = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_ACCEPTIGNOREPORTINFO) PortInfo();
		if (port == 0) // select all ports
			portinf->all = true;
		else
			portinf->portlist.push_front(port);
		
		status = acceptignoreinfo.AddElement(ip,portinf);
		if (status < 0)
		{
			RTPDelete(portinf,GetMemoryManager());
			return status;
		}
	}

	return 0;
}